

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rxreplaceinput.cpp
# Opt level: O0

void * __thiscall RXReplaceInput::qt_metacast(RXReplaceInput *this,char *_clname)

{
  int iVar1;
  char *_clname_local;
  RXReplaceInput *this_local;
  
  if (_clname == (char *)0x0) {
    this_local = (RXReplaceInput *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_meta_stringdata_RXReplaceInput.stringdata0);
    this_local = this;
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"RXBaseInput");
      if (iVar1 == 0) {
        this_local = (RXReplaceInput *)&this->super_RXBaseInput;
      }
      else {
        this_local = (RXReplaceInput *)QWidget::qt_metacast((char *)this);
      }
    }
  }
  return this_local;
}

Assistant:

void *RXReplaceInput::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_meta_stringdata_RXReplaceInput.stringdata0))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "RXBaseInput"))
        return static_cast< RXBaseInput*>(this);
    return QWidget::qt_metacast(_clname);
}